

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

FuncDef * sqlite3VtabOverloadFunction(sqlite3 *db,FuncDef *pDef,int nArg,Expr *pExpr)

{
  byte bVar1;
  char cVar2;
  Table *pTVar3;
  VTable *pVVar4;
  sqlite3_vtab *psVar5;
  sqlite3_module *psVar6;
  long lVar7;
  byte *pbVar8;
  u8 uVar9;
  u8 uVar10;
  undefined4 uVar11;
  int iVar12;
  char *z2;
  VTable **ppVVar13;
  byte *p;
  char *pcVar14;
  FuncDef *__s;
  long lVar15;
  size_t __n;
  uint uVar16;
  FuncDef *pFVar17;
  FuncDef *pFVar18;
  byte bVar19;
  void *pArg;
  _func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *xFunc;
  void *local_40;
  _func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *local_38;
  
  bVar19 = 0;
  local_38 = (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0;
  local_40 = (void *)0x0;
  if ((((pExpr != (Expr *)0x0) && (pExpr->op == 0x98)) &&
      (pTVar3 = pExpr->pTab, pTVar3 != (Table *)0x0)) && ((pTVar3->tabFlags & 0x10) != 0)) {
    ppVVar13 = &pTVar3->pVTable;
    do {
      pVVar4 = *ppVVar13;
      ppVVar13 = &pVVar4->pNext;
    } while (pVVar4->db != db);
    psVar5 = pVVar4->pVtab;
    psVar6 = psVar5->pModule;
    if ((psVar6->xFindFunction !=
         (_func_int_sqlite3_vtab_ptr_int_char_ptr_anon_subr_ptr_ptr_void_ptr_ptr *)0x0) &&
       (p = (byte *)sqlite3DbStrDup(db,pDef->zName), p != (byte *)0x0)) {
      bVar1 = *p;
      pbVar8 = p;
      while (bVar1 != 0) {
        *pbVar8 = ""[bVar1];
        bVar1 = pbVar8[1];
        pbVar8 = pbVar8 + 1;
      }
      iVar12 = (*psVar6->xFindFunction)(psVar5,nArg,(char *)p,&local_38,&local_40);
      sqlite3DbFree(db,p);
      if (iVar12 != 0) {
        pcVar14 = pDef->zName;
        if (pcVar14 == (char *)0x0) {
          uVar16 = 0x49;
        }
        else {
          uVar16 = 0xffffffff;
          do {
            uVar16 = uVar16 + 1;
            cVar2 = *pcVar14;
            pcVar14 = pcVar14 + 1;
          } while (cVar2 != '\0');
          uVar16 = (uVar16 & 0x3fffffff) + 0x49;
        }
        __s = (FuncDef *)sqlite3DbMallocRaw(db,uVar16);
        if (__s != (FuncDef *)0x0) {
          memset(__s,0,(ulong)uVar16);
          pFVar17 = pDef;
          pFVar18 = __s;
          for (lVar15 = 9; lVar15 != 0; lVar15 = lVar15 + -1) {
            uVar9 = pFVar17->iPrefEnc;
            uVar10 = pFVar17->flags;
            uVar11 = *(undefined4 *)&pFVar17->field_0x4;
            pFVar18->nArg = pFVar17->nArg;
            pFVar18->iPrefEnc = uVar9;
            pFVar18->flags = uVar10;
            *(undefined4 *)&pFVar18->field_0x4 = uVar11;
            pFVar17 = (FuncDef *)((long)pFVar17 + (ulong)bVar19 * -0x10 + 8);
            pFVar18 = (FuncDef *)((long)pFVar18 + (ulong)bVar19 * -0x10 + 8);
          }
          __s->zName = (char *)(__s + 1);
          pcVar14 = pDef->zName;
          if (pcVar14 == (char *)0x0) {
            __n = 1;
          }
          else {
            lVar15 = -1;
            do {
              lVar7 = lVar15 + 1;
              lVar15 = lVar15 + 1;
            } while (pcVar14[lVar7] != '\0');
            __n = (ulong)((uint)lVar15 & 0x3fffffff) + 1;
          }
          memcpy(__s + 1,pcVar14,__n);
          __s->xFunc = local_38;
          __s->pUserData = local_40;
          __s->flags = __s->flags | 4;
          pDef = __s;
        }
      }
    }
  }
  return pDef;
}

Assistant:

SQLITE_PRIVATE FuncDef *sqlite3VtabOverloadFunction(
  sqlite3 *db,    /* Database connection for reporting malloc problems */
  FuncDef *pDef,  /* Function to possibly overload */
  int nArg,       /* Number of arguments to the function */
  Expr *pExpr     /* First argument to the function */
){
  Table *pTab;
  sqlite3_vtab *pVtab;
  sqlite3_module *pMod;
  void (*xFunc)(sqlite3_context*,int,sqlite3_value**) = 0;
  void *pArg = 0;
  FuncDef *pNew;
  int rc = 0;
  char *zLowerName;
  unsigned char *z;


  /* Check to see the left operand is a column in a virtual table */
  if( NEVER(pExpr==0) ) return pDef;
  if( pExpr->op!=TK_COLUMN ) return pDef;
  pTab = pExpr->pTab;
  if( NEVER(pTab==0) ) return pDef;
  if( (pTab->tabFlags & TF_Virtual)==0 ) return pDef;
  pVtab = sqlite3GetVTable(db, pTab)->pVtab;
  assert( pVtab!=0 );
  assert( pVtab->pModule!=0 );
  pMod = (sqlite3_module *)pVtab->pModule;
  if( pMod->xFindFunction==0 ) return pDef;
 
  /* Call the xFindFunction method on the virtual table implementation
  ** to see if the implementation wants to overload this function 
  */
  zLowerName = sqlite3DbStrDup(db, pDef->zName);
  if( zLowerName ){
    for(z=(unsigned char*)zLowerName; *z; z++){
      *z = sqlite3UpperToLower[*z];
    }
    rc = pMod->xFindFunction(pVtab, nArg, zLowerName, &xFunc, &pArg);
    sqlite3DbFree(db, zLowerName);
  }
  if( rc==0 ){
    return pDef;
  }

  /* Create a new ephemeral function definition for the overloaded
  ** function */
  pNew = sqlite3DbMallocZero(db, sizeof(*pNew)
                             + sqlite3Strlen30(pDef->zName) + 1);
  if( pNew==0 ){
    return pDef;
  }
  *pNew = *pDef;
  pNew->zName = (char *)&pNew[1];
  memcpy(pNew->zName, pDef->zName, sqlite3Strlen30(pDef->zName)+1);
  pNew->xFunc = xFunc;
  pNew->pUserData = pArg;
  pNew->flags |= SQLITE_FUNC_EPHEM;
  return pNew;
}